

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void warn_equality_value(ly_ctx *ctx,lyxp_expr *exp,lyxp_set *set,uint16_t val_exp,
                        uint16_t equal_exp,uint16_t last_equal_exp)

{
  ushort uVar1;
  ly_ctx *ctx_00;
  int iVar2;
  lys_node *node;
  char *pcVar3;
  lys_module *plVar4;
  size_t __n;
  char *pcVar5;
  int_log_opts local_3c;
  ly_ctx *plStack_38;
  int_log_opts prev_ilo;
  
  plStack_38 = ctx;
  node = warn_get_snode_in_ctx(set);
  if (node == (lys_node *)0x0) {
    return;
  }
  if ((node->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
    return;
  }
  if (1 < exp->tokens[val_exp] - LYXP_TOKEN_LITERAL) {
    return;
  }
  pcVar5 = exp->expr + exp->expr_pos[val_exp];
  if (exp->tokens[val_exp] == LYXP_TOKEN_LITERAL) {
    pcVar5 = pcVar5 + 1;
    __n = (ulong)exp->tok_len[val_exp] - 2;
  }
  else {
    __n = (size_t)exp->tok_len[val_exp];
  }
  pcVar5 = strndup(pcVar5,__n);
  if (pcVar5 == (char *)0x0) {
    ly_log(plStack_38,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","warn_equality_value");
    return;
  }
  if (*(int *)&node[1].ref == 7) {
    pcVar3 = strchr(pcVar5,0x3a);
    ctx_00 = plStack_38;
    if (pcVar3 == (char *)0x0) {
      ly_log(plStack_38,LY_LLWRN,LY_SUCCESS,
             "Identityref \"%s\" comparison with identity \"%s\" without prefix, consider adding a prefix or best using \"derived-from(-or-self)()\" functions."
             ,node->name,pcVar5);
      uVar1 = exp->expr_pos[equal_exp];
      ly_log(ctx_00,LY_LLWRN,LY_SUCCESS,
             "Previous warning generated by XPath subexpression[%u] \"%.*s\".",(ulong)uVar1,
             (ulong)((uint)*(ushort *)((long)exp->tok_len + (ulong)((uint)last_equal_exp * 2)) +
                    ((uint)*(ushort *)((long)exp->expr_pos + (ulong)((uint)last_equal_exp * 2)) -
                    (uint)uVar1)),exp->expr + uVar1);
      if (*(int *)&node[1].ref != 7) goto LAB_00171de7;
    }
    plVar4 = lys_node_module(node);
    if ((plVar4->field_0x40 & 0x80) == 0) goto LAB_00171e61;
  }
LAB_00171de7:
  ly_ilo_change((ly_ctx *)0x0,ILO_ERR2WRN,&local_3c,(ly_err_item **)0x0);
  iVar2 = lyd_validate_value(node,pcVar5);
  ly_ilo_restore((ly_ctx *)0x0,local_3c,(ly_err_item *)0x0,0);
  if (iVar2 != 0) {
    uVar1 = exp->expr_pos[equal_exp];
    ly_log(plStack_38,LY_LLWRN,LY_SUCCESS,
           "Previous warning generated by XPath subexpression[%u] \"%.*s\".",(ulong)uVar1,
           (ulong)((uint)*(ushort *)((long)exp->tok_len + (ulong)((uint)last_equal_exp * 2)) +
                  ((uint)*(ushort *)((long)exp->expr_pos + (ulong)((uint)last_equal_exp * 2)) -
                  (uint)uVar1)),exp->expr + uVar1);
  }
LAB_00171e61:
  free(pcVar5);
  return;
}

Assistant:

static void
warn_equality_value(struct ly_ctx *ctx, struct lyxp_expr *exp, struct lyxp_set *set, uint16_t val_exp, uint16_t equal_exp,
                    uint16_t last_equal_exp)
{
    struct lys_node *snode;
    char *value;
    int ret;
    enum int_log_opts prev_ilo;

    if ((snode = warn_get_snode_in_ctx(set)) && (snode->nodetype & (LYS_LEAF | LYS_LEAFLIST))
            && ((exp->tokens[val_exp] == LYXP_TOKEN_LITERAL) || (exp->tokens[val_exp] == LYXP_TOKEN_NUMBER))) {
        /* check that the node can have the specified value */
        if (exp->tokens[val_exp] == LYXP_TOKEN_LITERAL) {
            value = strndup(exp->expr + exp->expr_pos[val_exp] + 1, exp->tok_len[val_exp] - 2);
        } else {
            value = strndup(exp->expr + exp->expr_pos[val_exp], exp->tok_len[val_exp]);
        }
        if (!value) {
            LOGMEM(ctx);
            return;
        }

        if ((((struct lys_node_leaf *)snode)->type.base == LY_TYPE_IDENT) && !strchr(value, ':')) {
            LOGWRN(ctx, "Identityref \"%s\" comparison with identity \"%s\" without prefix, consider adding"
                   " a prefix or best using \"derived-from(-or-self)()\" functions.", snode->name, value);
            LOGWRN(ctx, "Previous warning generated by XPath subexpression[%u] \"%.*s\".", exp->expr_pos[equal_exp],
                   (exp->expr_pos[last_equal_exp] - exp->expr_pos[equal_exp]) + exp->tok_len[last_equal_exp],
                   exp->expr + exp->expr_pos[equal_exp]);
        }

        /* we are unable to check identityref validity if this module (and any required imports) are not implemented */
        if ((((struct lys_node_leaf *)snode)->type.base != LY_TYPE_IDENT) || lys_node_module(snode)->implemented) {
            /* we want to print our message and more importantly a warning, not an error */
            ly_ilo_change(NULL, ILO_ERR2WRN, &prev_ilo, NULL);
            ret = lyd_validate_value(snode, value);
            ly_ilo_restore(NULL, prev_ilo, NULL, 0);
            if (ret) {
                LOGWRN(ctx, "Previous warning generated by XPath subexpression[%u] \"%.*s\".", exp->expr_pos[equal_exp],
                    (exp->expr_pos[last_equal_exp] - exp->expr_pos[equal_exp]) + exp->tok_len[last_equal_exp],
                    exp->expr + exp->expr_pos[equal_exp]);
            }
        }
        free(value);
    }
}